

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O2

Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
__thiscall
Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>
          (Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *__return_storage_ptr__,QKbo *this,Literal *l)

{
  _Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false> this_00;
  TermList ctx;
  Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_> OStack_b8;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:112:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:113:16),_Kernel::TermList>_>
  local_98;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:109:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:110:18),_Kernel::TermList>_>
  local_60;
  
  InequalityNormalizer::tryNormalizeInterpreted<Kernel::NumTraits<Kernel::RealConstantType>>
            (&OStack_b8,
             (this->_norm).
             super___shared_ptr<Kernel::InequalityNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,l);
  Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(__return_storage_ptr__);
  this_00._M_head_impl =
       (__return_storage_ptr__->_self)._M_t.
       super___uniq_ptr_impl<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
       .super__Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false>._M_head_impl;
  local_60._iter._inner._inn._iter._inner._to =
       ((long)((OStack_b8.
                super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                ._elem._elem.init._term._ptr)->_summands)._cursor -
       (long)((OStack_b8.
               super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._elem._elem.init._term._ptr)->_summands)._stack) / 0x30;
  local_60._iter._inner._inn._iter._inner._next = 0;
  local_60._iter._inner._inn._iter._inner._from = 0;
  local_60._iter._inner._inn._iter._func.a =
       &(OStack_b8.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>.
         _elem._elem.init._term._ptr)->_summands;
  local_60._iter._inner._next.
  super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>.
  super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>._elem =
       (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>)
       (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>)0x0;
  ctx = NumTraits<Kernel::RealConstantType>::
        sum<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_,false>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_2_,Kernel::TermList>>>
                  (&local_60);
  local_98._iter._inner._inn._iter._inner._to =
       ((long)((OStack_b8.
                super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                ._elem._elem.init._term._ptr)->_summands)._cursor -
       (long)((OStack_b8.
               super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._elem._elem.init._term._ptr)->_summands)._stack) / 0x30;
  local_98._iter._inner._inn._iter._inner._next = 0;
  local_98._iter._inner._inn._iter._inner._from = 0;
  local_98._iter._inner._inn._iter._func.a =
       &(OStack_b8.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>.
         _elem._elem.init._term._ptr)->_summands;
  local_98._iter._inner._next.
  super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>.
  super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>._elem =
       (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>)
       (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>)0x0;
  NumTraits<Kernel::RealConstantType>::
  sum<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_3_,false>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_4_,Kernel::TermList>>>
            (&local_98);
  MultiSet<Kernel::TermList>::init(this_00._M_head_impl,(EVP_PKEY_CTX *)ctx._content);
  return __return_storage_ptr__;
}

Assistant:

Recycled<MultiSet<TermList>> nfEquality(Literal* l) const
  {
    ASS(l->isEquality())
    using Num = typename NumTraits::ConstantType;
    auto norm = this->norm().template normalize<NumTraits>(l).unwrap();
    Recycled<MultiSet<TermList>> out;
    out->init(
      NumTraits::sum(
          iterTraits(norm.term().iterSummands())
            .filter([](auto x) { return x.numeral >= Num(0);  })
            .map([](auto x) { return x.denormalize(); })),
      NumTraits::sum(iterTraits(norm.term().iterSummands())
          .filter([](auto x) { return x.numeral <= Num(0);  })
          .map([](auto x) { return (-x).denormalize(); })));
    return out;

  }